

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O2

DataLocationUsage * __thiscall
kj::Vector<capnp::compiler::NodeTranslator::StructLayout::Group::DataLocationUsage>::
add<unsigned_int&>(Vector<capnp::compiler::NodeTranslator::StructLayout::Group::DataLocationUsage>
                   *this,uint *params)

{
  DataLocationUsage *pDVar1;
  uint uVar2;
  RemoveConst<capnp::compiler::NodeTranslator::StructLayout::Group::DataLocationUsage> *pRVar3;
  
  pRVar3 = (this->builder).pos;
  if (pRVar3 == (this->builder).endPtr) {
    grow(this,0);
    pRVar3 = (this->builder).pos;
  }
  uVar2 = *params;
  pRVar3->isUsed = true;
  pRVar3->lgSizeUsed = (uint8_t)uVar2;
  (pRVar3->holes).holes[0] = '\0';
  (pRVar3->holes).holes[1] = '\0';
  (pRVar3->holes).holes[2] = '\0';
  (pRVar3->holes).holes[3] = '\0';
  (pRVar3->holes).holes[4] = '\0';
  (pRVar3->holes).holes[5] = '\0';
  pDVar1 = (this->builder).pos;
  (this->builder).pos = pDVar1 + 1;
  return pDVar1;
}

Assistant:

inline T& add(Params&&... params) {
    if (builder.isFull()) grow();
    return builder.add(kj::fwd<Params>(params)...);
  }